

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O0

void __thiscall
compiler::CompilerAstWalker::onEnterWhileStatementAstNode
          (CompilerAstWalker *this,WhileStatementAstNode *param_1)

{
  element_type *peVar1;
  element_type *peVar2;
  size_type local_20;
  WhileStatementAstNode *local_18;
  WhileStatementAstNode *param_1_local;
  CompilerAstWalker *this_local;
  
  local_18 = param_1;
  param_1_local = (WhileStatementAstNode *)this;
  peVar1 = std::
           __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->ec);
  peVar2 = std::
           __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->ec);
  local_20 = std::vector<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>::size
                       (&peVar2->byteCode);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (&peVar1->loopStartIndices,&local_20);
  return;
}

Assistant:

void onEnterWhileStatementAstNode(WhileStatementAstNode*  /*node*/) noexcept override {
    this->ec->loopStartIndices.push_back(this->ec->byteCode.size());
  }